

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonExtractFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  uint uVar2;
  sqlite3_value *psVar3;
  Mem *pMVar4;
  char *pcVar5;
  void *pvVar6;
  u32 uVar7;
  uint uVar8;
  JsonParse *pParse;
  char *__s;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  uint N;
  long in_FS_OFFSET;
  undefined1 local_c0 [48];
  undefined1 *local_90;
  undefined1 *puStack_88;
  undefined1 *local_80;
  undefined1 *puStack_78;
  undefined1 *local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((1 < argc) && (pParse = jsonParseFuncArg(ctx,*argv,0), pParse != (JsonParse *)0x0)) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_c0._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pvVar6 = ctx->pFunc->pUserData;
    local_c0._8_8_ = local_c0 + 0x22;
    local_c0._16_8_ = 100;
    local_c0[0x20] = '\x01';
    local_c0[0x21] = '\0';
    local_c0[0x22] = -0x56;
    local_c0[0x23] = -0x56;
    local_c0[0x24] = -0x56;
    local_c0[0x25] = -0x56;
    local_c0[0x26] = -0x56;
    local_c0[0x27] = -0x56;
    if (argc != 2) {
      local_c0[0x20] = '\x01';
      local_c0[0x21] = '\0';
      local_c0[0x22] = '[';
      local_c0[0x23] = -0x56;
      local_c0[0x24] = -0x56;
      local_c0[0x25] = -0x56;
      local_c0[0x26] = -0x56;
      local_c0[0x27] = -0x56;
    }
    local_c0._25_7_ = 0;
    local_c0[0x18] = argc != 2;
    uVar11 = 1;
    local_c0._0_8_ = ctx;
    do {
      __s = (char *)sqlite3ValueText(argv[uVar11],'\x01');
      if (__s == (char *)0x0) goto LAB_001b7d08;
      sVar9 = strlen(__s);
      if (*__s != '$') {
        if (((ulong)pvVar6 & 3) != 0) {
          uVar8 = (uint)sVar9;
          N = uVar8 & 0x3fffffff;
          local_c0._8_8_ = local_c0 + 0x22;
          local_c0._16_8_ = 100;
          local_c0._24_8_ = 0;
          local_c0._32_2_ = 1;
          psVar3 = argv[uVar11];
          uVar2._0_2_ = psVar3->flags;
          uVar2._2_1_ = psVar3->enc;
          uVar2._3_1_ = psVar3->eSubtype;
          if ((0x50505050UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
            if ((sVar9 & 0x3fffffff) == 0) {
              uVar10 = 0;
LAB_001b7a35:
              if ((uint)uVar10 == N) goto LAB_001b7a3a;
              if ((N < 3 || *__s != '[') ||
                 (local_c0._0_8_ = ctx, __s[(ulong)(uVar8 & 0x3fffffff) - 1] != ']')) {
                local_c0._0_8_ = ctx;
                jsonAppendRawNZ((JsonString *)local_c0,".\"",2);
                jsonAppendRaw((JsonString *)local_c0,__s,N);
                pcVar5 = ".\"";
                uVar7 = 1;
                goto LAB_001b7abd;
              }
            }
            else {
              uVar10 = 0;
              do {
                if (((ulong)(byte)__s[uVar10] != 0x5f) && ((""[(byte)__s[uVar10]] & 6) == 0))
                goto LAB_001b7a35;
                uVar10 = uVar10 + 1;
              } while ((uVar8 & 0x3fffffff) != uVar10);
LAB_001b7a3a:
              local_c0._0_8_ = ctx;
              jsonAppendRawNZ((JsonString *)local_c0,".",1);
            }
            jsonAppendRaw((JsonString *)local_c0,__s,N);
          }
          else {
            local_c0._0_8_ = ctx;
            jsonAppendRawNZ((JsonString *)local_c0,"[",1);
            if (*__s == '-') {
              jsonAppendRawNZ((JsonString *)local_c0,"#",1);
            }
            jsonAppendRaw((JsonString *)local_c0,__s,N);
            pcVar5 = "[]";
            uVar7 = 2;
LAB_001b7abd:
            jsonAppendRawNZ((JsonString *)local_c0,pcVar5 + 1,uVar7);
          }
          jsonStringTerminate((JsonString *)local_c0);
          uVar7 = jsonLookupStep(pParse,0,(char *)local_c0._8_8_,0);
          if (local_c0[0x20] == '\0') {
            if (*(ulong *)(local_c0._8_8_ + -8) < 2) {
              sqlite3_free((long *)(local_c0._8_8_ + -8));
            }
            else {
              *(long *)(local_c0._8_8_ + -8) = *(ulong *)(local_c0._8_8_ + -8) - 1;
            }
          }
          local_c0._8_8_ = local_c0 + 0x22;
          local_c0._16_8_ = 100;
          local_c0._24_8_ = 0;
          local_c0[0x20] = '\x01';
          goto LAB_001b7b2b;
        }
LAB_001b7cfb:
        jsonBadPathError(ctx,__s);
        goto LAB_001b7d08;
      }
      uVar7 = jsonLookupStep(pParse,0,__s + 1,0);
LAB_001b7b2b:
      if (uVar7 < pParse->nBlob) {
        if (argc == 2) {
          if (((ulong)pvVar6 & 1) == 0) {
            jsonReturnFromBlob(pParse,uVar7,ctx,0);
            if ((((ulong)pvVar6 & 10) == 0) && (10 < (pParse->aBlob[uVar7] & 0xf))) {
              pMVar4 = ctx->pOut;
              pMVar4->eSubtype = 'J';
              pbVar1 = (byte *)((long)&pMVar4->flags + 1);
              *pbVar1 = *pbVar1 | 8;
            }
          }
          else {
            local_c0._16_8_ = 100;
            local_c0._24_8_ = 0;
            local_c0._32_2_ = 1;
            local_c0._0_8_ = ctx;
            local_c0._8_8_ = local_c0 + 0x22;
            jsonTranslateBlobToText(pParse,uVar7,(JsonString *)local_c0);
            jsonReturnString((JsonString *)local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
            if (local_c0[0x20] == '\0') {
              if (*(ulong *)(local_c0._8_8_ + -8) < 2) {
                sqlite3_free((long *)(local_c0._8_8_ + -8));
              }
              else {
                *(long *)(local_c0._8_8_ + -8) = *(ulong *)(local_c0._8_8_ + -8) - 1;
              }
            }
            local_c0._16_8_ = 100;
            local_c0._24_8_ = 0;
            local_c0[0x20] = '\x01';
            pMVar4 = ctx->pOut;
            pMVar4->eSubtype = 'J';
            pbVar1 = (byte *)((long)&pMVar4->flags + 1);
            *pbVar1 = *pbVar1 | 8;
            local_c0._8_8_ = local_c0 + 0x22;
          }
        }
        else {
          jsonAppendSeparator((JsonString *)local_c0);
          jsonTranslateBlobToText(pParse,uVar7,(JsonString *)local_c0);
        }
      }
      else {
        if (uVar7 != 0xfffffffe) {
          if (uVar7 != 0xffffffff) goto LAB_001b7cfb;
          ctx->isError = 1;
          sqlite3VdbeMemSetStr
                    (ctx->pOut,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
          ;
          goto LAB_001b7d08;
        }
        if (argc == 2) goto LAB_001b7d08;
        jsonAppendSeparator((JsonString *)local_c0);
        jsonAppendRawNZ((JsonString *)local_c0,"null",4);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (uint)argc);
    if (argc != 2) {
      if ((ulong)local_c0._24_8_ < (ulong)local_c0._16_8_) {
        *(char *)(local_c0._8_8_ + local_c0._24_8_) = ']';
        local_c0._24_8_ = local_c0._24_8_ + 1;
      }
      else {
        jsonAppendCharExpand((JsonString *)local_c0,']');
      }
      jsonReturnString((JsonString *)local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
      if (((ulong)pvVar6 & 8) == 0) {
        pMVar4 = ctx->pOut;
        pMVar4->eSubtype = 'J';
        pbVar1 = (byte *)((long)&pMVar4->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
    }
LAB_001b7d08:
    if (local_c0[0x20] == '\0') {
      if (*(ulong *)(local_c0._8_8_ + -8) < 2) {
        sqlite3_free((long *)(local_c0._8_8_ + -8));
      }
      else {
        *(long *)(local_c0._8_8_ + -8) = *(ulong *)(local_c0._8_8_ + -8) - 1;
      }
    }
    local_c0._16_8_ = 100;
    local_c0._24_8_ = 0;
    local_c0[0x20] = '\x01';
    local_c0._8_8_ = local_c0 + 0x22;
    jsonParseFree(pParse);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void jsonExtractFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p = 0;      /* The parse */
  int flags;             /* Flags associated with the function */
  int i;                 /* Loop counter */
  JsonString jx;         /* String for array result */

  if( argc<2 ) return;
  p = jsonParseFuncArg(ctx, argv[0], 0);
  if( p==0 ) return;
  flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  jsonStringInit(&jx, ctx);
  if( argc>2 ){
    jsonAppendChar(&jx, '[');
  }
  for(i=1; i<argc; i++){
    /* With a single PATH argument */
    const char *zPath = (const char*)sqlite3_value_text(argv[i]);
    int nPath;
    u32 j;
    if( zPath==0 ) goto json_extract_error;
    nPath = sqlite3Strlen30(zPath);
    if( zPath[0]=='$' ){
      j = jsonLookupStep(p, 0, zPath+1, 0);
    }else if( (flags & JSON_ABPATH) ){
      /* The -> and ->> operators accept abbreviated PATH arguments.  This
      ** is mostly for compatibility with PostgreSQL, but also for
      ** convenience.
      **
      **     NUMBER   ==>  $[NUMBER]     // PG compatible
      **     LABEL    ==>  $.LABEL       // PG compatible
      **     [NUMBER] ==>  $[NUMBER]     // Not PG.  Purely for convenience
      **
      ** Updated 2024-05-27:  If the NUMBER is negative, then PG counts from
      ** the right of the array.  Hence for negative NUMBER:
      **
      **     NUMBER   ==>  $[#NUMBER]    // PG compatible
      */
      jsonStringInit(&jx, ctx);
      if( sqlite3_value_type(argv[i])==SQLITE_INTEGER ){
        jsonAppendRawNZ(&jx, "[", 1);
        if( zPath[0]=='-' ) jsonAppendRawNZ(&jx,"#",1);
        jsonAppendRaw(&jx, zPath, nPath);
        jsonAppendRawNZ(&jx, "]", 2);
      }else if( jsonAllAlphanum(zPath, nPath) ){
        jsonAppendRawNZ(&jx, ".", 1);
        jsonAppendRaw(&jx, zPath, nPath);
      }else if( zPath[0]=='[' && nPath>=3 && zPath[nPath-1]==']' ){
        jsonAppendRaw(&jx, zPath, nPath);
      }else{
        jsonAppendRawNZ(&jx, ".\"", 2);
        jsonAppendRaw(&jx, zPath, nPath);
        jsonAppendRawNZ(&jx, "\"", 1);
      }
      jsonStringTerminate(&jx);
      j = jsonLookupStep(p, 0, jx.zBuf, 0);
      jsonStringReset(&jx);
    }else{
      jsonBadPathError(ctx, zPath);
      goto json_extract_error;
    }
    if( j<p->nBlob ){
      if( argc==2 ){
        if( flags & JSON_JSON ){
          jsonStringInit(&jx, ctx);
          jsonTranslateBlobToText(p, j, &jx);
          jsonReturnString(&jx, 0, 0);
          jsonStringReset(&jx);
          assert( (flags & JSON_BLOB)==0 );
          sqlite3_result_subtype(ctx, JSON_SUBTYPE);
        }else{
          jsonReturnFromBlob(p, j, ctx, 0);
          if( (flags & (JSON_SQL|JSON_BLOB))==0
           && (p->aBlob[j]&0x0f)>=JSONB_ARRAY
          ){
            sqlite3_result_subtype(ctx, JSON_SUBTYPE);
          }
        }
      }else{
        jsonAppendSeparator(&jx);
        jsonTranslateBlobToText(p, j, &jx);
      }
    }else if( j==JSON_LOOKUP_NOTFOUND ){
      if( argc==2 ){
        goto json_extract_error;  /* Return NULL if not found */
      }else{
        jsonAppendSeparator(&jx);
        jsonAppendRawNZ(&jx, "null", 4);
      }
    }else if( j==JSON_LOOKUP_ERROR ){
      sqlite3_result_error(ctx, "malformed JSON", -1);
      goto json_extract_error;
    }else{
      jsonBadPathError(ctx, zPath);
      goto json_extract_error;
    }
  }
  if( argc>2 ){
    jsonAppendChar(&jx, ']');
    jsonReturnString(&jx, 0, 0);
    if( (flags & JSON_BLOB)==0 ){
      sqlite3_result_subtype(ctx, JSON_SUBTYPE);
    }
  }
json_extract_error:
  jsonStringReset(&jx);
  jsonParseFree(p);
  return;
}